

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O1

uint32_t __thiscall AdsDevice::GetTimeout(AdsDevice *this)

{
  uint in_EAX;
  long adsErrorCode;
  AdsException *this_00;
  uint32_t timeout;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  adsErrorCode = AdsSyncGetTimeoutEx(*(this->m_LocalPort)._M_t.
                                      super___uniq_ptr_impl<const_long,_ResourceDeleter<const_long>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_const_long_*,_ResourceDeleter<const_long>_>
                                      .super__Head_base<0UL,_const_long_*,_false>._M_head_impl,
                                     (uint32_t *)((long)&uStack_18 + 4));
  if (adsErrorCode == 0) {
    return uStack_18._4_4_;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

uint32_t AdsDevice::GetTimeout() const
{
    uint32_t timeout = 0;
    const auto error = AdsSyncGetTimeoutEx(GetLocalPort(), &timeout);
    if (error) {
        throw AdsException(error);
    }
    return timeout;
}